

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

int duckdb_brotli::BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  int iVar1;
  int iVar2;
  uint8_t **next_out_00;
  BrotliEncoderStateInternal *state;
  size_t sVar3;
  uint8_t *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  uint8_t **in_R8;
  BrotliEncoderStateInternal *in_R9;
  size_t *unaff_retaddr;
  size_t *in_stack_00000008;
  int result;
  size_t total_out;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t max_out_size;
  uint8_t *output_start;
  uint8_t *input_start;
  size_t out_size;
  BrotliEncoderStateInternal *s;
  void *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  brotli_alloc_func in_stack_ffffffffffffff88;
  undefined8 uVar4;
  uint8_t *output;
  uint8_t *input;
  size_t *available_out_00;
  uint8_t **next_in_00;
  uint8_t **available_in_00;
  int local_4;
  
  available_in_00 = *(uint8_t ***)&in_R9->params;
  available_out_00 = in_stack_00000008;
  next_in_00 = in_R8;
  next_out_00 = (uint8_t **)BrotliEncoderMaxCompressedSize((size_t)in_RCX);
  if (available_in_00 == (uint8_t **)0x0) {
    local_4 = 0;
  }
  else if (in_RCX == (uint8_t *)0x0) {
    (in_R9->params).mode = BROTLI_MODE_TEXT;
    (in_R9->params).quality = 0;
    *(undefined1 *)in_stack_00000008 = 6;
    local_4 = 1;
  }
  else {
    state = BrotliEncoderCreateInstance
                      (in_stack_ffffffffffffff88,
                       (brotli_free_func)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    if (state == (BrotliEncoderStateInternal *)0x0) {
      local_4 = 0;
    }
    else {
      output = *(uint8_t **)&in_R9->params;
      uVar4 = 0;
      input = in_RCX;
      BrotliEncoderSetParameter(state,BROTLI_PARAM_QUALITY,in_EDI);
      BrotliEncoderSetParameter(state,BROTLI_PARAM_LGWIN,in_ESI);
      BrotliEncoderSetParameter(state,BROTLI_PARAM_MODE,in_EDX);
      BrotliEncoderSetParameter(state,BROTLI_PARAM_SIZE_HINT,(uint32_t)in_RCX);
      if (0x18 < (int)in_ESI) {
        BrotliEncoderSetParameter(state,BROTLI_PARAM_LARGE_WINDOW,1);
      }
      iVar1 = BrotliEncoderCompressStream
                        (in_R9,(BrotliEncoderOperation)((ulong)state >> 0x20),
                         (size_t *)available_in_00,next_in_00,available_out_00,next_out_00,
                         unaff_retaddr);
      iVar2 = BrotliEncoderIsFinished
                        ((BrotliEncoderStateInternal *)CONCAT44(iVar1,in_stack_ffffffffffffff80));
      if (iVar2 == 0) {
        iVar1 = 0;
      }
      (in_R9->params).mode = (int)uVar4;
      (in_R9->params).quality = (int)((ulong)uVar4 >> 0x20);
      BrotliEncoderDestroyInstance((BrotliEncoderStateInternal *)0x233f70a);
      if ((iVar1 == 0) ||
         ((next_out_00 != (uint8_t **)0x0 && (next_out_00 < *(uint8_t ***)&in_R9->params)))) {
        (in_R9->params).mode = BROTLI_MODE_GENERIC;
        (in_R9->params).quality = 0;
        if (next_out_00 == (uint8_t **)0x0) {
          local_4 = 0;
        }
        else if (available_in_00 < next_out_00) {
          local_4 = 0;
        }
        else {
          sVar3 = MakeUncompressedStream(input,(size_t)in_R8,output);
          (in_R9->params).mode = (int)sVar3;
          (in_R9->params).quality = (int)(sVar3 >> 0x20);
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t input_buffer[BROTLI_ARRAY_PARAM(input_size)],
    size_t* encoded_size,
    uint8_t encoded_buffer[BROTLI_ARRAY_PARAM(*encoded_size)]) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    /* TODO(eustas): check that parameters are sane. */
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}